

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledRgbaInputFile::readTiles
          (TiledRgbaInputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  int dx;
  int dx_00;
  int dy;
  Lock local_40;
  
  local_40._mutex = &this->_fromYa->super_Mutex;
  if ((FromYa *)local_40._mutex != (FromYa *)0x0) {
    std::mutex::lock(local_40._mutex);
    local_40._locked = true;
    for (; dx_00 = dxMin, dyMin <= dyMax; dyMin = dyMin + 1) {
      for (; dx_00 <= dxMax; dx_00 = dx_00 + 1) {
        FromYa::readTile(this->_fromYa,dx_00,dyMin,lx,ly);
      }
    }
    IlmThread_2_5::Lock::~Lock(&local_40);
    return;
  }
  TiledInputFile::readTiles(this->_inputFile,dxMin,dxMax,dyMin,dyMax,lx,ly);
  return;
}

Assistant:

void	
TiledRgbaInputFile::readTiles (int dxMin, int dxMax, int dyMin, int dyMax,
                               int lx, int ly)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);

        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
	        _fromYa->readTile (dx, dy, lx, ly);
    }
    else
    {
        _inputFile->readTiles (dxMin, dxMax, dyMin, dyMax, lx, ly);
    }
}